

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O1

void __thiscall
cmCTestHG::IdentifyParser::IdentifyParser
          (IdentifyParser *this,cmCTestHG *hg,char *prefix,string *rev)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__IdentifyParser_009c3de8;
  this->Rev = rev;
  (this->RegexIdentify).regmust = (char *)0x0;
  (this->RegexIdentify).program = (char *)0x0;
  (this->RegexIdentify).progsize = 0;
  memset(&this->RegexIdentify,0,0xaa);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(hg->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexIdentify,"^([0-9a-f]+)");
  return;
}

Assistant:

IdentifyParser(cmCTestHG* hg, const char* prefix, std::string& rev)
    : Rev(rev)
  {
    this->SetLog(&hg->Log, prefix);
    this->RegexIdentify.compile("^([0-9a-f]+)");
  }